

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

bool (anonymous_namespace)::
     TryGeneratedPaths<cmFindPackageCommand::SearchFrameworkPrefix(std::__cxx11::string_const&)::__0&,(anonymous_namespace)::cmAppendPathSegmentGenerator&>
               (anon_class_8_1_8991fb9c *filesCollector,string *startPath,
               cmAppendPathSegmentGenerator *gen)

{
  byte bVar1;
  bool bVar2;
  string local_80;
  int local_4c;
  undefined1 local_48 [8];
  string path;
  cmAppendPathSegmentGenerator *gen_local;
  string *startPath_local;
  anon_class_8_1_8991fb9c *filesCollector_local;
  
  path.field_2._8_8_ = gen;
  ResetGenerator<(anonymous_namespace)::cmAppendPathSegmentGenerator&>(gen);
  anon_unknown.dwarf_800e7f::cmAppendPathSegmentGenerator::GetNextCandidate
            ((string *)local_48,(cmAppendPathSegmentGenerator *)path.field_2._8_8_,startPath);
  do {
    bVar1 = std::__cxx11::string::empty();
    if (((bVar1 ^ 0xff) & 1) == 0) {
      local_4c = 2;
LAB_004f974d:
      std::__cxx11::string::~string((string *)local_48);
      if (local_4c != 1) {
        filesCollector_local._7_1_ = 0;
      }
      return (bool)(filesCollector_local._7_1_ & 1);
    }
    anon_unknown.dwarf_800e7f::ResetGenerator();
    bVar2 = TryGeneratedPaths<cmFindPackageCommand::SearchFrameworkPrefix(std::__cxx11::string_const&)::__0&>
                      (filesCollector,(string *)local_48);
    if (bVar2) {
      filesCollector_local._7_1_ = 1;
      local_4c = 1;
      goto LAB_004f974d;
    }
    anon_unknown.dwarf_800e7f::cmAppendPathSegmentGenerator::GetNextCandidate
              (&local_80,(cmAppendPathSegmentGenerator *)path.field_2._8_8_,startPath);
    std::__cxx11::string::operator=((string *)local_48,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  } while( true );
}

Assistant:

bool TryGeneratedPaths(CallbackFn&& filesCollector,
                       const std::string& startPath, Generator&& gen,
                       Rest&&... tail)
{
  ResetGenerator(std::forward<Generator&&>(gen));
  for (auto path = gen.GetNextCandidate(startPath); !path.empty();
       path = gen.GetNextCandidate(startPath)) {
    ResetGenerator(std::forward<Rest&&>(tail)...);
    if (TryGeneratedPaths(std::forward<CallbackFn&&>(filesCollector), path,
                          std::forward<Rest&&>(tail)...)) {
      return true;
    }
  }
  return false;
}